

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_opencl.cpp
# Opt level: O1

bool basisu::opencl_find_optimal_selector_clusters_for_each_block
               (opencl_context_ptr pContext,fosc_block_struct *pInput_block_info,
               uint32_t total_input_selectors,fosc_selector_struct *pInput_selectors,
               uint32_t *pSelector_cluster_indices,uint32_t *pOutput_selector_cluster_indices,
               bool perceptual)

{
  return false;
}

Assistant:

bool opencl_find_optimal_selector_clusters_for_each_block(
		opencl_context_ptr pContext,
		const fosc_block_struct* pInput_block_info,	// one per block
		uint32_t total_input_selectors,
		const fosc_selector_struct* pInput_selectors,
		const uint32_t* pSelector_cluster_indices,
		uint32_t* pOutput_selector_cluster_indices, // one per block
		bool perceptual)
	{
		BASISU_NOTE_UNUSED(pContext);
		BASISU_NOTE_UNUSED(pInput_block_info);
		BASISU_NOTE_UNUSED(total_input_selectors);
		BASISU_NOTE_UNUSED(pInput_selectors);
		BASISU_NOTE_UNUSED(pSelector_cluster_indices);
		BASISU_NOTE_UNUSED(pOutput_selector_cluster_indices);
		BASISU_NOTE_UNUSED(perceptual);

		return false;
	}